

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O2

anon_class_72_17_20e643c5 *
qclab::qgates::lambda_QGate2<float>
          (anon_class_72_17_20e643c5 *__return_storage_ptr__,Op op,SquareMatrix<float> *mat2,
          float *vector)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  long lVar17;
  float *pfVar18;
  
  if (mat2->size_ == 4) {
    dense::operateInPlace<qclab::dense::SquareMatrix<float>>(op,mat2);
    lVar17 = mat2->size_;
    pfVar18 = (mat2->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
              super__Head_base<0UL,_float_*,_false>._M_head_impl;
    fVar1 = *pfVar18;
    fVar2 = pfVar18[1];
    fVar3 = pfVar18[lVar17];
    fVar4 = (pfVar18 + 1)[lVar17];
    fVar5 = pfVar18[lVar17 * 2];
    fVar6 = (pfVar18 + 1)[lVar17 * 2];
    fVar7 = pfVar18[lVar17 * 3];
    fVar8 = (pfVar18 + 1)[lVar17 * 3];
    fVar9 = pfVar18[2];
    fVar10 = (pfVar18 + 2)[lVar17];
    fVar11 = (pfVar18 + 2)[lVar17 * 2];
    fVar12 = (pfVar18 + 2)[lVar17 * 3];
    fVar13 = pfVar18[3];
    fVar14 = (pfVar18 + 3)[lVar17];
    fVar15 = (pfVar18 + 3)[lVar17 * 2];
    fVar16 = (pfVar18 + 3)[lVar17 * 3];
    __return_storage_ptr__->vector = vector;
    __return_storage_ptr__->m11 = fVar1;
    __return_storage_ptr__->m12 = fVar3;
    __return_storage_ptr__->m13 = fVar5;
    __return_storage_ptr__->m14 = fVar7;
    __return_storage_ptr__->m21 = fVar2;
    __return_storage_ptr__->m22 = fVar4;
    __return_storage_ptr__->m23 = fVar6;
    __return_storage_ptr__->m24 = fVar8;
    __return_storage_ptr__->m31 = fVar9;
    __return_storage_ptr__->m32 = fVar10;
    __return_storage_ptr__->m33 = fVar11;
    __return_storage_ptr__->m34 = fVar12;
    __return_storage_ptr__->m41 = fVar13;
    __return_storage_ptr__->m42 = fVar14;
    __return_storage_ptr__->m43 = fVar15;
    __return_storage_ptr__->m44 = fVar16;
    return __return_storage_ptr__;
  }
  __assert_fail("mat2.size() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/src/qgates/apply.hpp"
                ,0xae,
                "auto qclab::qgates::lambda_QGate2(Op, qclab::dense::SquareMatrix<T>, T *) [T = float]"
               );
}

Assistant:

auto lambda_QGate2( Op op , qclab::dense::SquareMatrix< T > mat2 ,
                      T* vector ) {
    assert( mat2.size() == 4 ) ;
    // operation
    qclab::dense::operateInPlace( op , mat2 ) ;
    const T m11 = mat2( 0 , 0 ) ; const T m12 = mat2( 0 , 1 ) ;
    const T m13 = mat2( 0 , 2 ) ; const T m14 = mat2( 0 , 3 ) ;
    const T m21 = mat2( 1 , 0 ) ; const T m22 = mat2( 1 , 1 ) ;
    const T m23 = mat2( 1 , 2 ) ; const T m24 = mat2( 1 , 3 ) ;
    const T m31 = mat2( 2 , 0 ) ; const T m32 = mat2( 2 , 1 ) ;
    const T m33 = mat2( 2 , 2 ) ; const T m34 = mat2( 2 , 3 ) ;
    const T m41 = mat2( 3 , 0 ) ; const T m42 = mat2( 3 , 1 ) ;
    const T m43 = mat2( 3 , 2 ) ; const T m44 = mat2( 3 , 3 ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ,
                   const uint64_t c , const uint64_t d ) {
      const T x1 = vector[a] ;
      const T x2 = vector[b] ;
      const T x3 = vector[c] ;
      const T x4 = vector[d] ;
      vector[a] = m11 * x1 + m12 * x2 + m13 * x3 + m14 * x4 ;
      vector[b] = m21 * x1 + m22 * x2 + m23 * x3 + m24 * x4 ;
      vector[c] = m31 * x1 + m32 * x2 + m33 * x3 + m34 * x4 ;
      vector[d] = m41 * x1 + m42 * x2 + m43 * x3 + m44 * x4 ;
    } ;
    return f ;
  }